

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RAM.c
# Opt level: O0

uint8_t read_RAM(uint16_t address)

{
  uint16_t uVar1;
  uint8_t local_b;
  uint8_t retval;
  uint16_t address_local;
  
  uVar1 = sanitize_RAM_address(address);
  local_b = RAM[uVar1];
  if (uVar1 == 0x2002) {
    clear_vblank_bit();
    clear_write_toggle();
  }
  else if (uVar1 == 0x2007) {
    local_b = PPUDATA_VRAM_read();
    increment_ppu_address(RAM[0x2000]);
  }
  else if (uVar1 == 0x2004) {
    local_b = get_OAM_data();
  }
  else if (uVar1 == 0x4016) {
    local_b = read_controller();
  }
  return local_b;
}

Assistant:

uint8_t read_RAM(uint16_t address) {
    address = sanitize_RAM_address(address);
    uint8_t retval = RAM[address];

    if(address == PPUSTATUS_ADDRESS) {
        clear_vblank_bit();
        clear_write_toggle();
    }
    else if(address == PPUDATA_ADDRESS) {
        retval = PPUDATA_VRAM_read();
        increment_ppu_address(RAM[PPUCTRL_ADDRESS]);
    }
    else if(address == OAMDATA_ADDRESS)
        retval = get_OAM_data();
    else if(address == JOYPAD1_ADDRESS)
        retval = read_controller();

    return retval;
}